

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcorolib.c
# Opt level: O0

int luaB_costatus(lua_State *L)

{
  int iVar1;
  undefined1 local_98 [8];
  lua_Debug ar;
  lua_State *co;
  lua_State *L_local;
  
  ar.i_ci = (CallInfo *)getco(L);
  if (L == (lua_State *)ar.i_ci) {
    lua_pushstring(L,"running");
  }
  else {
    iVar1 = lua_status((lua_State *)ar.i_ci);
    if (iVar1 == 0) {
      iVar1 = lua_getstack((lua_State *)ar.i_ci,0,(lua_Debug *)local_98);
      if (iVar1 < 1) {
        iVar1 = lua_gettop((lua_State *)ar.i_ci);
        if (iVar1 == 0) {
          lua_pushstring(L,"dead");
        }
        else {
          lua_pushstring(L,"suspended");
        }
      }
      else {
        lua_pushstring(L,"normal");
      }
    }
    else if (iVar1 == 1) {
      lua_pushstring(L,"suspended");
    }
    else {
      lua_pushstring(L,"dead");
    }
  }
  return 1;
}

Assistant:

static int luaB_costatus (lua_State *L) {
  lua_State *co = getco(L);
  if (L == co) lua_pushliteral(L, "running");
  else {
    switch (lua_status(co)) {
      case LUA_YIELD:
        lua_pushliteral(L, "suspended");
        break;
      case LUA_OK: {
        lua_Debug ar;
        if (lua_getstack(co, 0, &ar) > 0)  /* does it have frames? */
          lua_pushliteral(L, "normal");  /* it is running */
        else if (lua_gettop(co) == 0)
            lua_pushliteral(L, "dead");
        else
          lua_pushliteral(L, "suspended");  /* initial state */
        break;
      }
      default:  /* some error occurred */
        lua_pushliteral(L, "dead");
        break;
    }
  }
  return 1;
}